

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aperiodicity_extraction.cc
# Opt level: O3

bool __thiscall
sptk::AperiodicityExtraction::Run
          (AperiodicityExtraction *this,vector<double,_std::allocator<double>_> *waveform,
          vector<double,_std::allocator<double>_> *f0,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *aperiodicity)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  vector<double,_std::allocator<double>_> length_fixed_f0;
  allocator_type local_61;
  vector<double,_std::allocator<double>_> local_60;
  double local_48;
  double dStack_40;
  
  if ((this->aperiodicity_extraction_ == (AperiodicityExtractionInterface *)0x0) ||
     (iVar2 = (*this->aperiodicity_extraction_->_vptr_AperiodicityExtractionInterface[3])(),
     (char)iVar2 == '\0')) {
    return false;
  }
  lVar4 = (long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(waveform->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
  lVar5 = lVar4 >> 3;
  auVar12._8_4_ = (int)(lVar4 >> 0x23);
  auVar12._0_8_ = lVar5;
  auVar12._12_4_ = 0x45300000;
  dStack_40 = auVar12._8_8_ - 1.9342813113834067e+25;
  local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
  iVar2 = (*this->aperiodicity_extraction_->_vptr_AperiodicityExtractionInterface[2])();
  dVar11 = ceil(local_48 / (double)iVar2);
  uVar8 = (uint)dVar11;
  uVar9 = (uint)((ulong)((long)(f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 3);
  if (uVar8 == uVar9) {
    iVar2 = (*this->aperiodicity_extraction_->_vptr_AperiodicityExtractionInterface[4])
                      (this->aperiodicity_extraction_,waveform,f0,aperiodicity);
    return SUB41(iVar2,0);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_60,(long)(int)uVar8,&local_61);
  uVar3 = uVar8;
  if ((int)uVar9 < (int)uVar8) {
    uVar3 = uVar9;
  }
  if (uVar3 != 0) {
    memmove(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start,
            (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start,(long)(int)uVar3 << 3);
  }
  auVar1 = _DAT_00118a10;
  auVar12 = _DAT_00118a00;
  if ((0 < (int)uVar9) && ((int)uVar9 < (int)uVar8)) {
    uVar10 = (ulong)(uVar9 & 0x7fffffff);
    if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start + uVar10 !=
        local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      dVar11 = (f0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish[-1];
      uVar6 = (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish +
              (-8 - (long)(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar10));
      auVar15._8_4_ = (int)uVar6;
      auVar15._0_8_ = uVar6;
      auVar15._12_4_ = (int)(uVar6 >> 0x20);
      auVar13._0_8_ = uVar6 >> 3;
      auVar13._8_8_ = auVar15._8_8_ >> 3;
      uVar7 = 0;
      auVar13 = auVar13 ^ _DAT_00118a10;
      do {
        auVar14._8_4_ = (int)uVar7;
        auVar14._0_8_ = uVar7;
        auVar14._12_4_ = (int)(uVar7 >> 0x20);
        auVar15 = (auVar14 | auVar12) ^ auVar1;
        if ((bool)(~(auVar15._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar15._0_4_ ||
                    auVar13._4_4_ < auVar15._4_4_) & 1)) {
          local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10 + uVar7] = dVar11;
        }
        if ((auVar15._12_4_ != auVar13._12_4_ || auVar15._8_4_ <= auVar13._8_4_) &&
            auVar15._12_4_ <= auVar13._12_4_) {
          local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10 + uVar7 + 1] = dVar11;
        }
        uVar7 = uVar7 + 2;
      } while (((uVar6 >> 3) + 2 & 0xfffffffffffffffe) != uVar7);
    }
  }
  iVar2 = (*this->aperiodicity_extraction_->_vptr_AperiodicityExtractionInterface[4])
                    (this->aperiodicity_extraction_,waveform,&local_60,aperiodicity);
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start == (pointer)0x0) {
    return (bool)(char)iVar2;
  }
  operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start);
  return (bool)(char)iVar2;
}

Assistant:

bool AperiodicityExtraction::Run(
    const std::vector<double>& waveform, const std::vector<double>& f0,
    std::vector<std::vector<double> >* aperiodicity) const {
  if (!IsValid()) {
    return false;
  }

  const int target_f0_length(
      static_cast<int>(std::ceil(static_cast<double>(waveform.size()) /
                                 aperiodicity_extraction_->GetFrameShift())));
  const int given_f0_length(static_cast<int>(f0.size()));
  if (target_f0_length == given_f0_length) {
    return aperiodicity_extraction_->Run(waveform, f0, aperiodicity);
  }

  std::vector<double> length_fixed_f0(target_f0_length);
  std::copy(f0.begin(),
            f0.begin() + std::min(target_f0_length, given_f0_length),
            length_fixed_f0.begin());
  if (1 <= given_f0_length && given_f0_length < target_f0_length) {
    std::fill(length_fixed_f0.begin() + given_f0_length, length_fixed_f0.end(),
              f0.back());
  }
  return aperiodicity_extraction_->Run(waveform, length_fixed_f0, aperiodicity);
}